

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O0

_Bool background_thread_create(tsd_t *tsd,uint arena_ind)

{
  _Bool _Var1;
  tsdn_t *in_RDI;
  _Bool ret;
  tsd_t *in_stack_00000018;
  malloc_mutex_t *in_stack_fffffffffffffff0;
  
  malloc_mutex_lock(in_RDI,in_stack_fffffffffffffff0);
  _Var1 = background_thread_create_locked(in_stack_00000018,tsd._4_4_);
  malloc_mutex_unlock(in_RDI,(malloc_mutex_t *)in_RDI);
  return _Var1;
}

Assistant:

bool
background_thread_create(tsd_t *tsd, unsigned arena_ind) {
	assert(have_background_thread);

	bool ret;
	malloc_mutex_lock(tsd_tsdn(tsd), &background_thread_lock);
	ret = background_thread_create_locked(tsd, arena_ind);
	malloc_mutex_unlock(tsd_tsdn(tsd), &background_thread_lock);

	return ret;
}